

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O0

int __thiscall
jsoncons::jsonpath::detail::
slice_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::select(slice_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  bool bVar1;
  result_options options;
  undefined7 extraout_var;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *peVar3;
  size_t sVar4;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *peVar6;
  undefined4 in_register_00000034;
  base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *index;
  undefined4 in_stack_00000008;
  size_t j_1;
  int64_t i_1;
  size_t j;
  int64_t i;
  int64_t step;
  int64_t end;
  int64_t start;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  result_options in_stack_ffffffffffffff34;
  base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffff38;
  path_node_type *in_stack_ffffffffffffff40;
  fd_set *current;
  path_node_type *in_stack_ffffffffffffff48;
  reference in_stack_ffffffffffffff50;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *root;
  slice *in_stack_ffffffffffffff58;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *context;
  base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffff60;
  base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *this_00;
  undefined8 in_stack_ffffffffffffff70;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *local_60;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *local_50;
  size_t local_40;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *local_38;
  int iVar2;
  path_node_type *ppVar5;
  
  index = (base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *)CONCAT44(in_register_00000034,__nfds);
  bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                    ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff48);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_ffffffffffffff38);
    local_38 = (eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                *)slice::get_start(in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50);
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_ffffffffffffff38);
    local_40 = slice::get_stop(in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50);
    peVar3 = (eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)slice::step(&this->slice_);
    if ((long)peVar3 < 1) {
      local_60 = peVar3;
      if ((long)peVar3 < 0) {
        context = local_38;
        sVar4 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                          ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           in_stack_ffffffffffffff38);
        if ((long)sVar4 <= (long)context) {
          sVar4 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             in_stack_ffffffffffffff38);
          local_38 = (eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                      *)(sVar4 - 1);
        }
        if ((long)local_40 < -1) {
          local_40 = 0xffffffffffffffff;
        }
        for (local_60 = local_38; (long)local_40 < (long)local_60;
            local_60 = peVar3 + (long)local_60) {
          root = local_60;
          peVar6 = (eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                    *)basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                                ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffff38);
          if (root < peVar6) {
            in_stack_ffffffffffffff38 = index;
            current = __readfds;
            in_stack_ffffffffffffff48 =
                 path_generator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 ::generate((eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                             *)in_stack_ffffffffffffff48,(path_node_type *)__readfds,(size_t)index,
                            in_stack_ffffffffffffff34);
            basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::operator[]
                      ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
            in_stack_ffffffffffffff28 = in_stack_00000008;
            base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
            ::tail_select(in_stack_ffffffffffffff60,context,(reference)root,
                          in_stack_ffffffffffffff48,(reference)current,
                          (node_receiver_type *)in_stack_ffffffffffffff38,
                          (result_options)in_stack_ffffffffffffff70);
          }
        }
      }
    }
    else {
      if ((long)local_38 < 0) {
        local_38 = (eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                    *)0x0;
      }
      sVar4 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                        ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         in_stack_ffffffffffffff38);
      if ((long)sVar4 < (long)local_40) {
        local_40 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                             ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *
                              )in_stack_ffffffffffffff38);
      }
      for (local_50 = local_38; local_60 = local_50, (long)local_50 < (long)local_40;
          local_50 = peVar3 + (long)local_50) {
        this_00 = index;
        ppVar5 = path_generator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 ::generate((eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                             *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                            (size_t)in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
        options = (result_options)ppVar5;
        basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::operator[]
                  ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        in_stack_ffffffffffffff28 = in_stack_00000008;
        base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
        ::tail_select(this_00,(eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                               *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                      in_stack_ffffffffffffff48,(reference)in_stack_ffffffffffffff40,
                      (node_receiver_type *)in_stack_ffffffffffffff38,options);
      }
    }
    iVar2 = (int)local_60;
  }
  return iVar2;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
                    reference root,
                    const path_node_type& last, 
                    reference current,
                    node_receiver_type& receiver,
                    result_options options) const override
        {
            if (current.is_array())
            {
                auto start = slice_.get_start(current.size());
                auto end = slice_.get_stop(current.size());
                auto step = slice_.step();

                if (step > 0)
                {
                    if (start < 0)
                    {
                        start = 0;
                    }
                    if (end > static_cast<int64_t>(current.size()))
                    {
                        end = current.size();
                    }
                    for (int64_t i = start; i < end; i += step)
                    {
                        auto j = static_cast<std::size_t>(i);
                        this->tail_select(context, root, 
                                            path_generator_type::generate(context, last, j, options), 
                                            current[j], receiver, options);
                    }
                }
                else if (step < 0)
                {
                    if (start >= static_cast<int64_t>(current.size()))
                    {
                        start = static_cast<int64_t>(current.size()) - 1;
                    }
                    if (end < -1)
                    {
                        end = -1;
                    }
                    for (int64_t i = start; i > end; i += step)
                    {
                        auto j = static_cast<std::size_t>(i);
                        if (j < current.size())
                        {
                            this->tail_select(context, root, 
                                                path_generator_type::generate(context, last,j,options), current[j], receiver, options);
                        }
                    }
                }
            }
        }